

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetAccessors
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,Var *getter,
          Var *setter)

{
  PropertyIndex PVar1;
  BOOL BVar2;
  Var pvVar3;
  
  PVar1 = TypePath::LookupInline
                    ((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.typePath.ptr,
                     propertyId,
                     (uint)((this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                            super_DynamicTypeHandler.unusedBytes >> 1));
  BVar2 = 0;
  if (PVar1 != 0xffff) {
    BVar2 = 0;
    if (((this->attributes).ptr[PVar1] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
      pvVar3 = DynamicObject::GetSlot(instance,(uint)PVar1);
      *getter = pvVar3;
      pvVar3 = DynamicObject::GetSlot(instance,(uint)(this->setters).ptr[PVar1]);
      *setter = pvVar3;
      BVar2 = 1;
    }
  }
  return BVar2;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetAccessors(DynamicObject* instance, PropertyId propertyId, _Outptr_result_maybenull_ Var* getter, _Outptr_result_maybenull_ Var* setter)
    {
        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            return false;
        }
        if (!(attributes[propertyIndex] & ObjectSlotAttr_Accessor))
        {
            return false;
        }
        *getter = instance->GetSlot(propertyIndex);
        *setter = instance->GetSlot(setters[propertyIndex]);
        return true;
    }